

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::Datum::ByteSizeLong(Datum *this)

{
  UnknownFieldSet *unknown_fields;
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar1 = 0;
  }
  else {
    unknown_fields = Datum::unknown_fields(this);
    sVar1 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  sVar1 = sVar1 + (ulong)(uint)(this->float_data_).current_size_ * 5;
  if ((uVar3 & 0x3f) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::BytesSize((this->data_).ptr_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 2) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->channels_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 4) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->height_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 8) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->width_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar3 & 0x10) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->label_);
      sVar1 = sVar1 + sVar2 + 1;
      uVar3 = (this->_has_bits_).has_bits_[0];
    }
    sVar1 = sVar1 + (uVar3 >> 4 & 2);
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t Datum::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.Datum)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float float_data = 6;
  {
    unsigned int count = this->float_data_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->float_data_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional bytes data = 4;
    if (has_data()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->data());
    }

    // optional int32 channels = 1;
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 2;
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 3;
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

    // optional int32 label = 5;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->label());
    }

    // optional bool encoded = 7 [default = false];
    if (has_encoded()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}